

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O3

void capnp::_::
     checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<unsigned_short> expected)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  Fault f;
  ulong local_40;
  ListElementCount local_34;
  
  uVar3 = expected._M_len;
  if (reader.builder.elementCount == uVar3) {
    if (uVar3 != 0) {
      uVar2 = 0;
      uVar4 = 1;
      iVar1 = kj::_::Debug::minSeverity;
      do {
        f.exception._0_2_ = expected._M_array[uVar2];
        local_40 = CONCAT62(local_40._2_6_,
                            *(unsigned_short *)
                             (reader.builder.ptr + (uVar2 * reader.builder.step >> 3)));
        if (((unsigned_short)f.exception !=
             *(unsigned_short *)(reader.builder.ptr + (uVar2 * reader.builder.step >> 3))) &&
           (iVar1 < 3)) {
          kj::_::Debug::log<char_const(&)[28],unsigned_short&,unsigned_short&>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
                     ,0x72,ERROR,"\"failed: expected \" \"(a) == (b)\", a, b",
                     (char (*) [28])"failed: expected (a) == (b)",(unsigned_short *)&f,
                     (unsigned_short *)&local_40);
          iVar1 = kj::_::Debug::minSeverity;
        }
        bVar5 = uVar4 < uVar3;
        uVar2 = uVar4;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (bVar5);
    }
    return;
  }
  local_34 = reader.builder.elementCount;
  local_40 = uVar3;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())","expected.size(), reader.size()",
             &local_40,&local_34);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}